

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLDocument::DeleteNode(XMLDocument *this,XMLNode *node)

{
  MemPool *pMVar1;
  
  pMVar1 = node->_memPool;
  if (node->_parent == (XMLNode *)0x0) {
    (*pMVar1->_vptr_MemPool[5])(pMVar1);
    pMVar1 = node->_memPool;
  }
  (*node->_vptr_XMLNode[0xf])(node);
  (*pMVar1->_vptr_MemPool[4])(pMVar1,node);
  return;
}

Assistant:

void XMLDocument::DeleteNode( XMLNode* node )	{
    TIXMLASSERT( node );
    TIXMLASSERT(node->_document == this );
    if (node->_parent) {
        node->_parent->DeleteChild( node );
    }
    else {
        // Isn't in the tree.
        // Use the parent delete.
        // Also, we need to mark it tracked: we 'know'
        // it was never used.
        node->_memPool->SetTracked();
        // Call the static XMLNode version:
        XMLNode::DeleteNode(node);
    }
}